

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(ze_device_compute_properties_t val)

{
  ostream *poVar1;
  long lVar2;
  string *in_RDI;
  ze_structure_type_t in_stack_00000008;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  uint in_stack_00000020;
  uint in_stack_00000024;
  uint in_stack_00000028;
  uint in_stack_0000002c;
  uint in_stack_00000030;
  uint in_stack_00000034;
  uint in_stack_00000038;
  stringstream ss;
  string sStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1b8,in_stack_00000008);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = std::operator<<((ostream *)(local_1b8 + 0x10),"0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000018);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_0000001c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000020);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000024);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000028);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_0000002c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000030);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000034);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::to_string((string *)local_1b8,in_stack_00000038);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  local_1b8._8_8_ = 0;
  local_1a8[0]._M_local_buf[0] = '\0';
  local_1b8._0_8_ = (ostream *)(local_1b8 + 0x10);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    std::__cxx11::to_string(&sStack_218,*(uint *)(&stack0x0000003c + lVar2));
    std::__cxx11::string::append((string *)local_1b8);
    std::__cxx11::string::~string((string *)&sStack_218);
    std::__cxx11::string::append((char *)local_1b8);
  }
  std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_1b8);
  std::operator+(&local_1d8,"[ ",&local_1f8);
  std::operator+(&sStack_218,&local_1d8," ]");
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string( const ze_device_compute_properties_t val )
{
    std::string str;
    
    str += "stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "maxTotalGroupSize : ";
    str += std::to_string(val.maxTotalGroupSize);
    str += "\n";
    
    str += "maxGroupSizeX : ";
    str += std::to_string(val.maxGroupSizeX);
    str += "\n";
    
    str += "maxGroupSizeY : ";
    str += std::to_string(val.maxGroupSizeY);
    str += "\n";
    
    str += "maxGroupSizeZ : ";
    str += std::to_string(val.maxGroupSizeZ);
    str += "\n";
    
    str += "maxGroupCountX : ";
    str += std::to_string(val.maxGroupCountX);
    str += "\n";
    
    str += "maxGroupCountY : ";
    str += std::to_string(val.maxGroupCountY);
    str += "\n";
    
    str += "maxGroupCountZ : ";
    str += std::to_string(val.maxGroupCountZ);
    str += "\n";
    
    str += "maxSharedLocalMemory : ";
    str += std::to_string(val.maxSharedLocalMemory);
    str += "\n";
    
    str += "numSubGroupSizes : ";
    str += std::to_string(val.numSubGroupSizes);
    str += "\n";
    
    str += "subGroupSizes : ";
    {
        std::string tmp;
        for( auto& entry : val.subGroupSizes )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}